

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsMapping.c
# Opt level: O2

char * Mips_insn_name(csh handle,uint id)

{
  if (0x271 < id) {
    return (char *)0x0;
  }
  return insn_name_maps[id].name;
}

Assistant:

const char *Mips_insn_name(csh handle, unsigned int id)
{
#ifndef CAPSTONE_DIET
	if (id >= MIPS_INS_ENDING)
		return NULL;

	return insn_name_maps[id].name;
#else
	return NULL;
#endif
}